

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_rep.c
# Opt level: O1

nsync_time nsync_time_sub(nsync_time a,nsync_time b)

{
  long lVar1;
  long lVar2;
  long lVar3;
  nsync_time nVar4;
  
  lVar1 = b.tv_nsec;
  lVar3 = a.tv_nsec;
  lVar2 = lVar3 + 1000000000;
  if (lVar1 <= lVar3) {
    lVar2 = lVar3;
  }
  nVar4.tv_sec = (a.tv_sec - b.tv_sec) - (ulong)(lVar3 < lVar1);
  nVar4.tv_nsec = lVar2 - lVar1;
  return nVar4;
}

Assistant:

nsync_time nsync_time_sub (nsync_time a, nsync_time b) {
	a.tv_sec -= b.tv_sec;
	if (a.tv_nsec < b.tv_nsec) {
		a.tv_nsec += NSYNC_NS_IN_S_;
		a.tv_sec--;
	}
	a.tv_nsec -= b.tv_nsec;
	return (a);
}